

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::IsMine(CWallet *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  isminetype iVar4;
  CScript *script;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = pCVar2 != pCVar3;
  if (bVar5) {
    iVar4 = IsMine(this,&pCVar2->scriptPubKey);
    if (iVar4 == ISMINE_NO) {
      script = &pCVar2[1].scriptPubKey;
      do {
        bVar6 = (pointer)((long)(script + -1) + 0x18) == pCVar3;
        bVar5 = !bVar6;
        if (bVar6) break;
        iVar4 = IsMine(this,script);
        script = (CScript *)((long)(script + 1) + 8);
      } while (iVar4 == ISMINE_NO);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsMine(const CTransaction& tx) const
{
    AssertLockHeld(cs_wallet);
    for (const CTxOut& txout : tx.vout)
        if (IsMine(txout))
            return true;
    return false;
}